

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.h
# Opt level: O2

string * __thiscall
spvtools::utils::
MakeString<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
          (string *__return_storage_ptr__,utils *this,
          __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          first,__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                last,bool assert_found_terminating_null)

{
  uint uVar1;
  long lVar2;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  pos;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (; this != (utils *)first._M_current; this = this + 4) {
    uVar1 = *(uint *)this;
    for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 8) {
      if ((char)(uVar1 >> ((byte)lVar2 & 0x1f)) == '\0') {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  if ((char)last._M_current == '\0') {
    return __return_storage_ptr__;
  }
  __assert_fail("!assert_found_terminating_null && \"Did not find terminating null for the string.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/string_utils.h"
                ,0x65,
                "std::string spvtools::utils::MakeString(InputIt, InputIt, bool) [InputIt = __gnu_cxx::__normal_iterator<const unsigned int *, std::vector<unsigned int>>]"
               );
}

Assistant:

inline std::string MakeString(InputIt first, InputIt last,
                              bool assert_found_terminating_null = true) {
  std::string result;
  constexpr size_t kCharsPerWord = sizeof(*first);
  static_assert(kCharsPerWord == 4, "expect 4-byte word");

  for (InputIt pos = first; pos != last; ++pos) {
    uint32_t word = *pos;
    for (size_t byte_index = 0; byte_index < kCharsPerWord; byte_index++) {
      uint32_t extracted_word = (word >> (8 * byte_index)) & 0xFF;
      char c = static_cast<char>(extracted_word);
      if (c == 0) {
        return result;
      }
      result += c;
    }
  }
  assert(!assert_found_terminating_null &&
         "Did not find terminating null for the string.");
  (void)assert_found_terminating_null; /* No unused parameters in release
                                          builds. */
  return result;
}